

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmFileCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  string install_always;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,command,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00641bf8;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 4;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  (this->Rename)._M_dataplus._M_p = (pointer)&(this->Rename).field_2;
  (this->Rename)._M_string_length = 0;
  (this->Rename).field_2._M_local_buf[0] = '\0';
  (this->Manifest)._M_dataplus._M_p = (pointer)&(this->Manifest).field_2;
  (this->Manifest)._M_string_length = 0;
  (this->Manifest).field_2._M_local_buf[0] = '\0';
  (this->super_cmFileCopier).UseSourcePermissions = false;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS",&local_60);
  if (bVar1) {
    bVar1 = cmSystemTools::IsOn(&local_60);
    (this->super_cmFileCopier).Always = bVar1;
  }
  this_00 = (this->super_cmFileCopier).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INSTALL_MANIFEST_FILES",&local_61);
  cmMakefile::GetSafeDefinition(this_00,&local_40);
  std::__cxx11::string::_M_assign((string *)&this->Manifest);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

cmFileInstaller::cmFileInstaller(cmFileCommand* command)
  : cmFileCopier(command, "INSTALL")
  , InstallType(cmInstallType_FILES)
  , Optional(false)
  , MessageAlways(false)
  , MessageLazy(false)
  , MessageNever(false)
  , DestDirLength(0)
{
  // Installation does not use source permissions by default.
  this->UseSourcePermissions = false;
  // Check whether to copy files always or only if they have changed.
  std::string install_always;
  if (cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS", install_always)) {
    this->Always = cmSystemTools::IsOn(install_always);
  }
  // Get the current manifest.
  this->Manifest =
    this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
}